

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this)

{
  TPZRegisterClassId *in_RDI;
  void **in_stack_00000038;
  int64_t in_stack_ffffffffffffffb8;
  TPZRefPattern *in_stack_ffffffffffffffd8;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0246c838);
  TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>,
             in_stack_00000038);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246c510;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246c510;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x130),in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}